

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O1

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,false>::
emplace<llvm::DWARFDebugNames::Entry_const&>
          (OptionalStorage<llvm::DWARFDebugNames::Entry,false> *this,Entry *args)

{
  Abbrev *pAVar1;
  
  if (this[0xb8] == (OptionalStorage<llvm::DWARFDebugNames::Entry,false>)0x1) {
    *(undefined ***)this = &PTR___cxa_pure_virtual_01097f30;
    if (*(OptionalStorage<llvm::DWARFDebugNames::Entry,false> **)(this + 8) != this + 0x18) {
      free(*(OptionalStorage<llvm::DWARFDebugNames::Entry,false> **)(this + 8));
    }
    this[0xb8] = (OptionalStorage<llvm::DWARFDebugNames::Entry,false>)0x0;
  }
  *(undefined ***)this = &PTR___cxa_pure_virtual_01097f30;
  SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
            ((SmallVector<llvm::DWARFFormValue,_3U> *)(this + 8),&(args->super_Entry).Values);
  *(undefined ***)this = &PTR_getCUOffset_01097e30;
  pAVar1 = args->Abbr;
  *(NameIndex **)(this + 0xa8) = args->NameIdx;
  *(Abbrev **)(this + 0xb0) = pAVar1;
  this[0xb8] = (OptionalStorage<llvm::DWARFDebugNames::Entry,false>)0x1;
  return;
}

Assistant:

void emplace(Args &&... args) {
    reset();
    ::new ((void *)std::addressof(value)) T(std::forward<Args>(args)...);
    hasVal = true;
  }